

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintestlogger.cpp
# Opt level: O0

void __thiscall QPlainTestLogger::stopLogging(QPlainTestLogger *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  QAbstractTestLogger *in_RDI;
  long in_FS_OFFSET;
  int timeMs;
  char buf [1024];
  undefined4 in_stack_fffffffffffffb8c;
  undefined4 in_stack_fffffffffffffb94;
  char local_408 [1024];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_408,0xaa,0x400);
  QTestLog::msecsTotalTime();
  iVar1 = qRound(6.16756473607357e-318);
  iVar2 = QTestLog::verboseLevel();
  if (iVar2 < 0) {
    uVar3 = QTestLog::passCount();
    uVar4 = QTestLog::failCount();
    uVar5 = QTestLog::skipCount();
    iVar2 = QTestLog::blacklistCount();
    snprintf(local_408,0x400,"Totals: %d passed, %d failed, %d skipped, %d blacklisted, %dms\n",
             (ulong)uVar3,(ulong)uVar4,(ulong)uVar5);
  }
  else {
    uVar3 = QTestLog::passCount();
    uVar4 = QTestLog::failCount();
    uVar5 = QTestLog::skipCount();
    iVar2 = QTestLog::blacklistCount();
    pcVar6 = QTestResult::currentTestObjectName();
    snprintf(local_408,0x400,
             "Totals: %d passed, %d failed, %d skipped, %d blacklisted, %dms\n********* Finished testing of %s *********\n"
             ,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,iVar2,iVar1,pcVar6);
  }
  outputMessage((QPlainTestLogger *)CONCAT44(in_stack_fffffffffffffb94,iVar1),
                (char *)CONCAT44(in_stack_fffffffffffffb8c,iVar2));
  QAbstractTestLogger::stopLogging(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPlainTestLogger::stopLogging()
{
    char buf[1024];
    const int timeMs = qRound(QTestLog::msecsTotalTime());
    if (QTestLog::verboseLevel() < 0) {
        std::snprintf(buf, sizeof(buf),
                      "Totals: %d passed, %d failed, %d skipped, %d blacklisted, %dms\n",
                      QTestLog::passCount(), QTestLog::failCount(),
                      QTestLog::skipCount(), QTestLog::blacklistCount(), timeMs);
    } else {
        std::snprintf(buf, sizeof(buf),
                      "Totals: %d passed, %d failed, %d skipped, %d blacklisted, %dms\n"
                      "********* Finished testing of %s *********\n",
                      QTestLog::passCount(), QTestLog::failCount(),
                      QTestLog::skipCount(), QTestLog::blacklistCount(), timeMs,
                      QTestResult::currentTestObjectName());
    }
    outputMessage(buf);

    QAbstractTestLogger::stopLogging();
}